

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

void __thiscall Imf_3_4::Context::Context(Context *this)

{
  undefined8 *puVar1;
  shared_ptr<_priv_exr_context_t_*> *in_RDI;
  
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  std::shared_ptr<_priv_exr_context_t*>::
  shared_ptr<_priv_exr_context_t*,Imf_3_4::Context::Context()::__0,void>(in_RDI);
  return;
}

Assistant:

Context::Context ()
    : _ctxt (new exr_context_t(), [] (exr_context_t* todel) {
        exr_finish (todel);
        delete todel;
    })
{
}